

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLURL::setURL(XMLURL *this,XMLURL *baseURL,XMLCh *relativeURL)

{
  cleanUp(this);
  parse(this,relativeURL);
  if (((this->fProtocol != Unknown) && (this->fPath != (XMLCh *)0x0)) && (*this->fPath == L'/')) {
    return;
  }
  conglomerateWithBase(this,baseURL,true);
  return;
}

Assistant:

void XMLURL::setURL(const XMLURL&         baseURL
                  , const XMLCh* const    relativeURL)
{
    cleanUp();

	// Parse our URL string
    parse(relativeURL);

    // If its relative, then conglomerate with the base URL
    if (isRelative())
		conglomerateWithBase(baseURL);
}